

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

int Dar_LibCutMatch(Dar_Man_t *p,Dar_Cut_t *pCut)

{
  char cVar1;
  char *pcVar2;
  Vec_Int_t *p_00;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  float fVar6;
  int local_3c;
  float Prob;
  int i;
  char *pPerm;
  uint uPhase;
  Aig_Obj_t *pFanin;
  Dar_Cut_t *pCut_local;
  Dar_Man_t *p_local;
  
  if (*(uint *)&pCut->field_0x4 >> 0x1d != 4) {
    __assert_fail("pCut->nLeaves == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                  ,0x2c8,"int Dar_LibCutMatch(Dar_Man_t *, Dar_Cut_t *)");
  }
  cVar1 = s_DarLib->pPhases[*(uint *)&pCut->field_0x4 & 0xffff];
  pcVar2 = s_DarLib->pPerms4[(int)s_DarLib->pPerms[*(uint *)&pCut->field_0x4 & 0xffff]];
  local_3c = 0;
  while( true ) {
    if ((int)(*(uint *)&pCut->field_0x4 >> 0x1d) <= local_3c) {
      p->nCutsGood = p->nCutsGood + 1;
      return 1;
    }
    pAVar4 = Aig_ManObj(p->pAig,pCut->pLeaves[(int)pcVar2[local_3c]]);
    if (pAVar4 == (Aig_Obj_t *)0x0) break;
    pAVar4 = Aig_NotCond(pAVar4,(uint)(int)cVar1 >> ((byte)local_3c & 0x1f) & 1);
    s_DarLib->pDatas[local_3c].field_0.pFunc = pAVar4;
    pAVar5 = Aig_Regular(pAVar4);
    s_DarLib->pDatas[local_3c].Level =
         (uint)((ulong)*(undefined8 *)&pAVar5->field_0x18 >> 0x20) & 0xffffff;
    if (p->pPars->fPower != 0) {
      p_00 = p->pAig->vProbs;
      pAVar5 = Aig_Regular(pAVar4);
      iVar3 = Aig_ObjId(pAVar5);
      iVar3 = Vec_IntEntry(p_00,iVar3);
      fVar6 = Abc_Int2Float(iVar3);
      iVar3 = Aig_IsComplement(pAVar4);
      if (iVar3 != 0) {
        fVar6 = 1.0 - fVar6;
      }
      s_DarLib->pDatas[local_3c].dProb = fVar6;
    }
    local_3c = local_3c + 1;
  }
  p->nCutsBad = p->nCutsBad + 1;
  return 0;
}

Assistant:

int Dar_LibCutMatch( Dar_Man_t * p, Dar_Cut_t * pCut )
{
    Aig_Obj_t * pFanin;
    unsigned uPhase;
    char * pPerm;
    int i;
    assert( pCut->nLeaves == 4 );
    // get the fanin permutation
    uPhase = s_DarLib->pPhases[pCut->uTruth];
    pPerm = s_DarLib->pPerms4[ (int)s_DarLib->pPerms[pCut->uTruth] ];
    // collect fanins with the corresponding permutation/phase
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
    {
        pFanin = Aig_ManObj( p->pAig, pCut->pLeaves[ (int)pPerm[i] ] );
        if ( pFanin == NULL )
        {
            p->nCutsBad++;
            return 0;
        }
        pFanin = Aig_NotCond(pFanin, ((uPhase >> i) & 1) );
        s_DarLib->pDatas[i].pFunc = pFanin;
        s_DarLib->pDatas[i].Level = Aig_Regular(pFanin)->Level;
        // copy the propability of node being one
        if ( p->pPars->fPower )
        {
            float Prob = Abc_Int2Float( Vec_IntEntry( p->pAig->vProbs, Aig_ObjId(Aig_Regular(pFanin)) ) );
            s_DarLib->pDatas[i].dProb = Aig_IsComplement(pFanin)? 1.0-Prob : Prob;
        }
    }
    p->nCutsGood++;
    return 1;
}